

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

adh_node_t * hash_get_value(adh_weight_t weight,adh_order_t order)

{
  adh_node_t *paVar1;
  uint uVar2;
  adh_node_t *current_node;
  hash_entry_t *entry;
  adh_node_t *paStack_18;
  int hash_index;
  adh_node_t *node_result;
  adh_order_t order_local;
  adh_weight_t weight_local;
  
  paStack_18 = (adh_node_t *)0x0;
  uVar2 = hash_get_index(weight);
  node_result._2_2_ = order;
  for (current_node = (adh_node_t *)map_weight_nodes.buckets[(int)uVar2];
      current_node != (adh_node_t *)0x0; current_node = *(adh_node_t **)&current_node->order) {
    paVar1 = *(adh_node_t **)current_node;
    if (((paVar1->weight == weight) && (node_result._2_2_ < paVar1->order)) &&
       (paVar1 != adh_root_node)) {
      node_result._2_2_ = paVar1->order;
      paStack_18 = paVar1;
    }
  }
  return paStack_18;
}

Assistant:

adh_node_t* hash_get_value(adh_weight_t weight, adh_order_t order) {
    adh_node_t* node_result = NULL;
    int hash_index = hash_get_index(weight);
    hash_entry_t* entry = map_weight_nodes.buckets[hash_index];
    while(entry) {
        adh_node_t* current_node = entry->value;

        if(current_node->weight != weight) {
#ifdef _DEBUG
            collision++;
            hash_check_collision(weight, hash_index, current_node);
#endif
        }
        else if(current_node->order > order && current_node != adh_root_node) {
            node_result = current_node;
            order = node_result->order;
        }
        entry = entry->next;
    }
    return node_result;
}